

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_string<std::vector<char,std::allocator<char>>>
          (result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  location<std::vector<char,_std::allocator<char>_>_> *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  location<std::vector<char,_std::allocator<char>_>_> *plVar3;
  location<std::vector<char,_std::allocator<char>_>_> *plVar4;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_d9;
  string local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  undefined8 local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string local_98;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  plVar4 = *(location<std::vector<char,_std::allocator<char>_>_> **)(this + 0x40);
  plVar3 = *(location<std::vector<char,_std::allocator<char>_>_> **)(*(long *)(this + 8) + 8);
  if (plVar4 != plVar3) {
    if (*(char *)&(plVar4->super_region_base)._vptr_region_base == '\"') {
      plVar1 = (location<std::vector<char,_std::allocator<char>_>_> *)
               ((long)&(plVar4->super_region_base)._vptr_region_base + 1);
      if ((((plVar1 != plVar3) && (*(char *)&(plVar1->super_region_base)._vptr_region_base == '\"'))
          && (plVar4 = (location<std::vector<char,_std::allocator<char>_>_> *)
                       ((long)&(plVar4->super_region_base)._vptr_region_base + 2), plVar4 != plVar3)
          ) && (*(char *)&(plVar4->super_region_base)._vptr_region_base == '\"')) {
        parse_ml_basic_string<std::vector<char,std::allocator<char>>>
                  (__return_storage_ptr__,this,plVar1);
        return __return_storage_ptr__;
      }
      parse_basic_string<std::vector<char,std::allocator<char>>>(__return_storage_ptr__,this,plVar1)
      ;
      return __return_storage_ptr__;
    }
    if ((plVar4 != plVar3) && (*(char *)&(plVar4->super_region_base)._vptr_region_base == '\'')) {
      plVar1 = (location<std::vector<char,_std::allocator<char>_>_> *)
               ((long)&(plVar4->super_region_base)._vptr_region_base + 1);
      if (((plVar1 != plVar3) &&
          ((*(char *)&(plVar1->super_region_base)._vptr_region_base == '\'' &&
           (plVar4 = (location<std::vector<char,_std::allocator<char>_>_> *)
                     ((long)&(plVar4->super_region_base)._vptr_region_base + 2), plVar4 != plVar3)))
          ) && (*(char *)&(plVar4->super_region_base)._vptr_region_base == '\'')) {
        parse_ml_literal_string<std::vector<char,std::allocator<char>>>
                  (__return_storage_ptr__,this,plVar1);
        return __return_storage_ptr__;
      }
      parse_literal_string<std::vector<char,std::allocator<char>>>
                (__return_storage_ptr__,this,plVar1);
      return __return_storage_ptr__;
    }
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"[error] toml::parse_string: ","");
  local_78 = (undefined1  [8])this;
  local_70._M_p = (pointer)&local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"the next token is not a string","");
  __l._M_len = 1;
  __l._M_array = (iterator)local_78;
  std::
  vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_50,__l,&local_d9);
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  format_underline(&local_d8,&local_98,&local_50,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
    local_a8._8_8_ = local_d8.field_2._8_8_;
    local_b8 = &local_a8;
  }
  else {
    local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_d8._M_dataplus._M_p;
  }
  local_a8._M_allocated_capacity._1_7_ = local_d8.field_2._M_allocated_capacity._1_7_;
  local_a8._M_local_buf[0] = local_d8.field_2._M_local_buf[0];
  __return_storage_ptr__->is_ok_ = false;
  paVar2 = &(__return_storage_ptr__->field_1).fail.value.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)&__return_storage_ptr__->field_1 = paVar2;
  if (local_b8 == &local_a8) {
    paVar2->_M_allocated_capacity = local_a8._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8) =
         local_a8._8_8_;
  }
  else {
    (__return_storage_ptr__->field_1).fail.value._M_dataplus._M_p = (pointer)local_b8;
    (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity =
         local_a8._M_allocated_capacity;
  }
  (__return_storage_ptr__->field_1).fail.value._M_string_length = local_d8._M_string_length;
  local_a8._M_allocated_capacity = (ulong)(uint7)local_d8.field_2._M_allocated_capacity._1_7_ << 8;
  local_b0 = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_d8._M_string_length = 0;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_b8 = &local_a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  std::
  vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<toml::string, region<Container>>, std::string>
parse_string(location<Container>& loc)
{
    if(loc.iter() != loc.end() && *(loc.iter()) == '"')
    {
        if(loc.iter() + 1 != loc.end() && *(loc.iter() + 1) == '"' &&
           loc.iter() + 2 != loc.end() && *(loc.iter() + 2) == '"')
        {
            return parse_ml_basic_string(loc);
        }
        else
        {
            return parse_basic_string(loc);
        }
    }
    else if(loc.iter() != loc.end() && *(loc.iter()) == '\'')
    {
        if(loc.iter() + 1 != loc.end() && *(loc.iter() + 1) == '\'' &&
           loc.iter() + 2 != loc.end() && *(loc.iter() + 2) == '\'')
        {
            return parse_ml_literal_string(loc);
        }
        else
        {
            return parse_literal_string(loc);
        }
    }
    return err(format_underline("[error] toml::parse_string: ",
                {{std::addressof(loc), "the next token is not a string"}}));
}